

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

int mpack_node_int(mpack_node_t node)

{
  anon_union_8_7_c87e5bf0_for_value aVar1;
  mpack_tree_t *pmVar2;
  mpack_node_data_t *pmVar3;
  
  pmVar2 = node.tree;
  pmVar3 = node.data;
  if (pmVar2->error != mpack_ok) {
    return 0;
  }
  if (pmVar3->type == mpack_type_int) {
    aVar1 = pmVar3->value;
    if ((int)aVar1.f != aVar1.i) goto LAB_00105584;
  }
  else if ((pmVar3->type != mpack_type_uint) || (aVar1 = pmVar3->value, 0x7fffffff < aVar1.u)) {
LAB_00105584:
    pmVar2->error = mpack_error_type;
    if (pmVar2->error_fn == (mpack_tree_error_t)0x0) {
      return 0;
    }
    (*pmVar2->error_fn)(pmVar2,mpack_error_type);
    return 0;
  }
  return (int)aVar1.f;
}

Assistant:

MPACK_INLINE int mpack_node_int(mpack_node_t node) {

    // This should be true at compile-time, so this just wraps the 32-bit function.
    if (sizeof(int) == 4)
        return (int)mpack_node_i32(node);

    // Otherwise we use i64 and check the range.
    int64_t val = mpack_node_i64(node);
    if (val >= INT_MIN && val <= INT_MAX)
        return (int)val;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}